

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ne_fop_DDDD(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                    _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict8 *gen)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 v;
  TCGv_i32 src2;
  TCGv_i32 src1;
  TCGv_i32 src0;
  TCGv_i32 dst;
  TCGContext_conflict8 *tcg_ctx;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict8 *gen_local;
  int rs2_local;
  int rs1_local;
  int rd_local;
  DisasContext_conflict8 *dc_local;
  
  pTVar1 = dc->uc->tcg_ctx;
  pTVar2 = gen_load_fpr_D(dc,rs1);
  pTVar3 = gen_load_fpr_D(dc,rs2);
  pTVar4 = gen_load_fpr_D(dc,rd);
  v = gen_dest_fpr_D(dc,rd);
  (*gen)(pTVar1,v,pTVar4,pTVar2,pTVar3);
  gen_store_fpr_D(dc,rd,v);
  return;
}

Assistant:

static inline void gen_ne_fop_DDDD(DisasContext *dc, int rd, int rs1, int rs2,
                           void (*gen)(TCGContext *, TCGv_i64, TCGv_i64, TCGv_i64, TCGv_i64))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i64 dst, src0, src1, src2;

    src1 = gen_load_fpr_D(dc, rs1);
    src2 = gen_load_fpr_D(dc, rs2);
    src0 = gen_load_fpr_D(dc, rd);
    dst = gen_dest_fpr_D(dc, rd);

    gen(tcg_ctx, dst, src0, src1, src2);

    gen_store_fpr_D(dc, rd, dst);
}